

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigReference.cpp
# Opt level: O2

vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_> * __thiscall
deqp::egl::ConfigFilter::filter
          (vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>
           *__return_storage_ptr__,ConfigFilter *this,
          vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_> *configs)

{
  bool bVar1;
  pointer config;
  
  (__return_storage_ptr__->
  super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (config = (configs->
                super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>
                )._M_impl.super__Vector_impl_data._M_start;
      config != (configs->
                super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>
                )._M_impl.super__Vector_impl_data._M_finish; config = config + 1) {
    bVar1 = isMatch(this,config);
    if (bVar1) {
      std::vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>::push_back
                (__return_storage_ptr__,config);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SurfaceConfig> filter (const std::vector<SurfaceConfig>& configs) const
	{
		std::vector<SurfaceConfig> out;

		for (std::vector<SurfaceConfig>::const_iterator iter = configs.begin(); iter != configs.end(); iter++)
		{
			if (isMatch(*iter)) out.push_back(*iter);
		}

		return out;
	}